

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O2

void __thiscall WeightedReservoir_Basic_Test::TestBody(WeightedReservoir_Basic_Test *this)

{
  char *pcVar1;
  int i;
  long lVar2;
  float fVar3;
  float local_108 [2];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  AssertionResult gtest_ar;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  float weights [16];
  RNG rng;
  atomic<int> count [16];
  
  rng.state = 0x853c49e6748fea9b;
  rng.inc = 0xda3e39cb94b95bdb;
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    fVar3 = pbrt::RNG::Uniform<float>(&rng);
    weights[lVar2] = fVar3 * fVar3 + 0.05;
  }
  local_e8._M_unused._M_object = weights;
  local_e8._8_8_ = count;
  local_d0 = std::
             _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp:1010:29)>
             ::_M_invoke;
  count[0].super___atomic_base<int>._M_i = (__atomic_base<int>)0x0;
  count[1].super___atomic_base<int>._M_i = (__atomic_base<int>)0x0;
  count[2].super___atomic_base<int>._M_i = (__atomic_base<int>)0x0;
  count[3].super___atomic_base<int>._M_i = (__atomic_base<int>)0x0;
  count[4].super___atomic_base<int>._M_i = (__atomic_base<int>)0x0;
  count[5].super___atomic_base<int>._M_i = (__atomic_base<int>)0x0;
  count[6].super___atomic_base<int>._M_i = (__atomic_base<int>)0x0;
  count[7].super___atomic_base<int>._M_i = (__atomic_base<int>)0x0;
  count[8].super___atomic_base<int>._M_i = (__atomic_base<int>)0x0;
  count[9].super___atomic_base<int>._M_i = (__atomic_base<int>)0x0;
  count[10].super___atomic_base<int>._M_i = (__atomic_base<int>)0x0;
  count[0xb].super___atomic_base<int>._M_i = (__atomic_base<int>)0x0;
  count[0xc].super___atomic_base<int>._M_i = (__atomic_base<int>)0x0;
  count[0xd].super___atomic_base<int>._M_i = (__atomic_base<int>)0x0;
  count[0xe].super___atomic_base<int>._M_i = (__atomic_base<int>)0x0;
  count[0xf].super___atomic_base<int>._M_i = (__atomic_base<int>)0x0;
  local_d8 = std::
             _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp:1010:29)>
             ::_M_manager;
  pbrt::ParallelFor(0,1000000,(function<void_(long,_long)> *)&local_e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_e8);
  fVar3 = 0.0;
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 4) {
    fVar3 = fVar3 + *(float *)((long)weights + lVar2);
  }
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    local_100.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (((double)count[lVar2].super___atomic_base<int>._M_i * 0.97) / 1000000.0);
    local_108[0] = weights[lVar2] / fVar3;
    testing::internal::CmpHelperLE<double,float>
              ((internal *)&gtest_ar,".97 * count[i] / double(nTrials)","weights[i] / sumW",
               (double *)&local_100,local_108);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_100);
      pcVar1 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x410,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_108,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_108);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_100);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_100.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (((double)count[lVar2].super___atomic_base<int>._M_i * 1.03) / 1000000.0);
    local_108[0] = weights[lVar2] / fVar3;
    testing::internal::CmpHelperGE<double,float>
              ((internal *)&gtest_ar,"1.03 * count[i] / double(nTrials)","weights[i] / sumW",
               (double *)&local_100,local_108);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_100);
      pcVar1 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x411,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_108,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_108);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_100);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  return;
}

Assistant:

TEST(WeightedReservoir, Basic) {
    RNG rng;
    constexpr int n = 16;
    float weights[n];
    for (int i = 0; i < n; ++i)
        weights[i] = .05 + Sqr(rng.Uniform<Float>());

    std::atomic<int> count[n] = {};
    int64_t nTrials = 1000000;
    ParallelFor(0, nTrials, [&](int64_t start, int64_t end) {
#ifdef PBRT_IS_MSVC
        // MSVC2019 doesn't seem to capture this as constexpr...
        constexpr int n = 16;
#endif
        RNG rng(3 * start);
        int localCount[n] = {};

        for (int64_t i = start; i < end; ++i) {
            WeightedReservoirSampler<int> wrs(i);
            int perm[n];
            for (int j = 0; j < n; ++j)
                perm[j] = j;

            for (int j = 0; j < n; ++j) {
                int index = perm[j];
                wrs.Add(index, weights[index]);
            }

            int index = wrs.GetSample();
            ASSERT_TRUE(index >= 0 && index < n);
            ++localCount[index];
        }

        for (int i = 0; i < n; ++i)
            count[i] += localCount[i];
    });

    Float sumW = std::accumulate(std::begin(weights), std::end(weights), Float(0));
    for (int i = 0; i < n; ++i) {
        EXPECT_LE(.97 * count[i] / double(nTrials), weights[i] / sumW);
        EXPECT_GE(1.03 * count[i] / double(nTrials), weights[i] / sumW);
    }
}